

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

TriggerPrg * getRowTrigger(Parse *pParse,Trigger *pTrigger,Table *pTab,int orconf)

{
  sqlite3 *db;
  sqlite3 *db_00;
  Vdbe *p;
  int *piVar1;
  VdbeOp *pVVar2;
  u8 uVar3;
  int iVar4;
  uint dest;
  TriggerPrg *pTVar5;
  SubProgram *pSVar6;
  Parse *pParse_00;
  Vdbe *pVVar7;
  char *pcVar8;
  Expr *pEVar9;
  SrcList *pSVar10;
  ExprList *pChanges;
  IdList *pColumn;
  Select *pSVar11;
  Parse *pPVar12;
  TriggerStep *pStep;
  NameContext local_88;
  SelectDest local_50;
  
  pPVar12 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pPVar12 = pParse;
  }
  pTVar5 = pPVar12->pTriggerPrg;
  while( true ) {
    if (pTVar5 == (TriggerPrg *)0x0) {
      db = pParse->db;
      pTVar5 = (TriggerPrg *)sqlite3DbMallocZero(db,0x28);
      if (pTVar5 != (TriggerPrg *)0x0) {
        pTVar5->pNext = pPVar12->pTriggerPrg;
        pPVar12->pTriggerPrg = pTVar5;
        pSVar6 = (SubProgram *)sqlite3DbMallocZero(db,0x30);
        pTVar5->pProgram = pSVar6;
        if (pSVar6 != (SubProgram *)0x0) {
          pVVar7 = pPVar12->pVdbe;
          pSVar6->pNext = pVVar7->pProgram;
          pVVar7->pProgram = pSVar6;
          pTVar5->pTrigger = pTrigger;
          pTVar5->orconf = orconf;
          pTVar5->aColmask[0] = 0xffffffff;
          pTVar5->aColmask[1] = 0xffffffff;
          pParse_00 = (Parse *)sqlite3DbMallocZero(db,0x250);
          if (pParse_00 != (Parse *)0x0) {
            local_88.pSrcList = (SrcList *)0x0;
            local_88.pNext = (NameContext *)0x0;
            local_88.nRef = 0;
            local_88.nErr = 0;
            local_88.pEList = (ExprList *)0x0;
            local_88.pAggInfo = (AggInfo *)0x0;
            local_88.ncFlags = 0;
            local_88._50_6_ = 0;
            pParse_00->db = db;
            pParse_00->pTriggerTab = pTab;
            pParse_00->pToplevel = pPVar12;
            pParse_00->zAuthContext = pTrigger->zName;
            pParse_00->eTriggerOp = pTrigger->op;
            pParse_00->nQueryLoop = pParse->nQueryLoop;
            pVVar7 = pParse_00->pVdbe;
            local_88.pParse = pParse_00;
            if (pVVar7 == (Vdbe *)0x0) {
              pVVar7 = allocVdbe(pParse_00);
            }
            if (pVVar7 != (Vdbe *)0x0) {
              dest = 0;
              pcVar8 = sqlite3MPrintf(db,"-- TRIGGER %s",pTrigger->zName);
              sqlite3VdbeChangeP4(pVVar7,-1,pcVar8,-7);
              if (pTrigger->pWhen != (Expr *)0x0) {
                dest = 0;
                pEVar9 = exprDup(db,pTrigger->pWhen,0,(u8 **)0x0);
                iVar4 = sqlite3ResolveExprNames(&local_88,pEVar9);
                if ((iVar4 == 0) && (db->mallocFailed == '\0')) {
                  dest = sqlite3VdbeMakeLabel(pVVar7);
                  sqlite3ExprIfFalse(pParse_00,pEVar9,dest,0x10);
                }
                if (pEVar9 != (Expr *)0x0) {
                  sqlite3ExprDeleteNN(db,pEVar9);
                }
              }
              pStep = pTrigger->step_list;
              if (pStep != (TriggerStep *)0x0) {
                db_00 = pParse_00->db;
                p = pParse_00->pVdbe;
                do {
                  uVar3 = (u8)orconf;
                  if (orconf == 10) {
                    uVar3 = pStep->orconf;
                  }
                  pParse_00->eOrconf = uVar3;
                  uVar3 = pStep->op;
                  if (uVar3 == 'l') {
                    pSVar10 = targetSrcList(pParse_00,pStep);
                    pSVar11 = sqlite3SelectDup(db_00,pStep->pSelect,0);
                    pColumn = sqlite3IdListDup(db_00,pStep->pIdList);
                    sqlite3Insert(pParse_00,pSVar10,pSVar11,pColumn,(uint)pParse_00->eOrconf);
                  }
                  else if (uVar3 == 'm') {
                    pSVar10 = targetSrcList(pParse_00,pStep);
                    if (pStep->pWhere == (Expr *)0x0) {
                      pEVar9 = (Expr *)0x0;
                    }
                    else {
                      pEVar9 = exprDup(db_00,pStep->pWhere,0,(u8 **)0x0);
                    }
                    sqlite3DeleteFrom(pParse_00,pSVar10,pEVar9);
                  }
                  else if (uVar3 == 'n') {
                    pSVar10 = targetSrcList(pParse_00,pStep);
                    pChanges = sqlite3ExprListDup(db_00,pStep->pExprList,0);
                    if (pStep->pWhere == (Expr *)0x0) {
                      pEVar9 = (Expr *)0x0;
                    }
                    else {
                      pEVar9 = exprDup(db_00,pStep->pWhere,0,(u8 **)0x0);
                    }
                    sqlite3Update(pParse_00,pSVar10,pChanges,pEVar9,(uint)pParse_00->eOrconf);
                  }
                  else {
                    pSVar11 = sqlite3SelectDup(db_00,pStep->pSelect,0);
                    local_50.eDest = '\x04';
                    local_50.iSDParm = 0;
                    local_50.iSdst = 0;
                    local_50._12_8_ = 0;
                    local_50.zAffSdst._4_4_ = 0;
                    sqlite3Select(pParse_00,pSVar11,&local_50);
                    if (pSVar11 != (Select *)0x0) {
                      clearSelect(db_00,pSVar11,1);
                    }
                  }
                  if (pStep->op != 'w') {
                    sqlite3VdbeAddOp3(p,0x77,0,0,0);
                  }
                  pStep = pStep->pNext;
                } while (pStep != (TriggerStep *)0x0);
              }
              if ((dest != 0) && (piVar1 = pVVar7->pParse->aLabel, piVar1 != (int *)0x0)) {
                piVar1[(int)~dest] = pVVar7->nOp;
              }
              sqlite3VdbeAddOp3(pVVar7,0x37,0,0,0);
              pcVar8 = pParse_00->zErrMsg;
              if (pParse->nErr == 0) {
                pParse->zErrMsg = pcVar8;
                pParse->nErr = pParse_00->nErr;
                pParse->rc = pParse_00->rc;
              }
              else if (pcVar8 != (char *)0x0) {
                sqlite3DbFreeNN(pParse_00->db,pcVar8);
              }
              if (db->mallocFailed == '\0') {
                pVVar2 = pVVar7->aOp;
                resolveP2Values(pVVar7,&pPVar12->nMaxArg);
                pSVar6->nOp = pVVar7->nOp;
                pVVar7->aOp = (Op *)0x0;
                pSVar6->aOp = pVVar2;
              }
              pSVar6->nMem = pParse_00->nMem;
              pSVar6->nCsr = pParse_00->nTab;
              pSVar6->token = pTrigger;
              pTVar5->aColmask[0] = pParse_00->oldmask;
              pTVar5->aColmask[1] = pParse_00->newmask;
              sqlite3VdbeDelete(pVVar7);
            }
            sqlite3ParserReset(pParse_00);
            sqlite3DbFreeNN(db,pParse_00);
            return pTVar5;
          }
        }
      }
      return (TriggerPrg *)0x0;
    }
    if ((pTVar5->pTrigger == pTrigger) && (pTVar5->orconf == orconf)) break;
    pTVar5 = pTVar5->pNext;
  }
  return pTVar5;
}

Assistant:

static TriggerPrg *getRowTrigger(
  Parse *pParse,       /* Current parse context */
  Trigger *pTrigger,   /* Trigger to code */
  Table *pTab,         /* The table trigger pTrigger is attached to */
  int orconf           /* ON CONFLICT algorithm. */
){
  Parse *pRoot = sqlite3ParseToplevel(pParse);
  TriggerPrg *pPrg;

  assert( pTrigger->zName==0 || pTab==tableOfTrigger(pTrigger) );

  /* It may be that this trigger has already been coded (or is in the
  ** process of being coded). If this is the case, then an entry with
  ** a matching TriggerPrg.pTrigger field will be present somewhere
  ** in the Parse.pTriggerPrg list. Search for such an entry.  */
  for(pPrg=pRoot->pTriggerPrg; 
      pPrg && (pPrg->pTrigger!=pTrigger || pPrg->orconf!=orconf); 
      pPrg=pPrg->pNext
  );

  /* If an existing TriggerPrg could not be located, create a new one. */
  if( !pPrg ){
    pPrg = codeRowTrigger(pParse, pTrigger, pTab, orconf);
  }

  return pPrg;
}